

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_NodeStore * UA_NodeStore_new(void)

{
  uint uVar1;
  UA_UInt16 UVar2;
  UA_NodeStore *__ptr;
  UA_NodeStoreEntry **ppUVar3;
  
  __ptr = (UA_NodeStore *)malloc(0x18);
  if (__ptr != (UA_NodeStore *)0x0) {
    UVar2 = higher_prime_index(0x40);
    __ptr->sizePrimeIndex = (uint)UVar2;
    uVar1 = primes[UVar2];
    __ptr->size = uVar1;
    __ptr->count = 0;
    ppUVar3 = (UA_NodeStoreEntry **)calloc((ulong)uVar1,8);
    __ptr->entries = ppUVar3;
    if (ppUVar3 != (UA_NodeStoreEntry **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (UA_NodeStore *)0x0;
}

Assistant:

UA_NodeStore *
UA_NodeStore_new(void) {
    UA_NodeStore *ns = UA_malloc(sizeof(UA_NodeStore));
    if(!ns)
        return NULL;
    ns->sizePrimeIndex = higher_prime_index(UA_NODESTORE_MINSIZE);
    ns->size = primes[ns->sizePrimeIndex];
    ns->count = 0;
    ns->entries = UA_calloc(ns->size, sizeof(UA_NodeStoreEntry*));
    if(!ns->entries) {
        UA_free(ns);
        return NULL;
    }
    return ns;
}